

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

string * get_model_endpoint_abi_cxx11_(void)

{
  char *pcVar1;
  char *__s;
  string *in_RDI;
  
  pcVar1 = getenv("MODEL_ENDPOINT");
  __s = getenv("HF_ENDPOINT");
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  if (__s != (char *)0x0) {
    pcVar1 = (char *)in_RDI->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)in_RDI,0,pcVar1,(ulong)__s);
    if ((in_RDI->_M_dataplus)._M_p[in_RDI->_M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::string get_model_endpoint() {
    const char * model_endpoint_env = getenv("MODEL_ENDPOINT");
    // We still respect the use of environment-variable "HF_ENDPOINT" for backward-compatibility.
    const char * hf_endpoint_env = getenv("HF_ENDPOINT");
    const char * endpoint_env = model_endpoint_env ? model_endpoint_env : hf_endpoint_env;
    std::string model_endpoint = "https://huggingface.co/";
    if (endpoint_env) {
        model_endpoint = endpoint_env;
        if (model_endpoint.back() != '/') model_endpoint += '/';
    }
    return model_endpoint;
}